

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O2

void __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
::evaluate_port_b_output
          (MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
           *this)

{
  byte bVar1;
  
  bVar1 = (this->super_MOS6522Storage).registers_.auxiliary_control & 0x80;
  Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler::
  set_port_output(this->bus_handler_,B,(this->super_MOS6522Storage).registers_.output[1] | bVar1,
                  bVar1 | (this->super_MOS6522Storage).registers_.data_direction[1]);
  return;
}

Assistant:

void MOS6522<T>::evaluate_port_b_output() {
	// Apply current timer-linked PB7 output if any atop the stated output.
	const uint8_t timer_control_bit = registers_.auxiliary_control & 0x80;
	bus_handler_.set_port_output(
		Port::B,
		(registers_.output[1] & (0xff ^ timer_control_bit)) | timer_control_bit,
		registers_.data_direction[1] | timer_control_bit);
}